

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

TRef snap_replay_const(jit_State *J,IRIns *ir)

{
  IRIns *ir_local;
  jit_State *J_local;
  
  switch((ir->field_1).o) {
  case '\x16':
    J_local._4_4_ =
         (0x7fff - ((ir->field_1).t.irt & 0x1f)) + ((ir->field_1).t.irt & 0x1f) * 0x1000000;
    break;
  case '\x17':
    J_local._4_4_ = lj_ir_kint(J,ir->i);
    break;
  case '\x18':
    J_local._4_4_ = lj_ir_kgc(J,(GCobj *)ir[1],(uint)(ir->field_1).t.irt);
    break;
  case '\x19':
    J_local._4_4_ = lj_ir_kptr_(J,IR_KPTR,(void *)ir[1]);
    break;
  default:
    J_local._4_4_ = 0x7fff;
    break;
  case '\x1c':
  case '\x1d':
    J_local._4_4_ = lj_ir_k64(J,(uint)(ir->field_1).o,(uint64_t)ir[1]);
  }
  return J_local._4_4_;
}

Assistant:

static TRef snap_replay_const(jit_State *J, IRIns *ir)
{
  /* Only have to deal with constants that can occur in stack slots. */
  switch ((IROp)ir->o) {
  case IR_KPRI: return TREF_PRI(irt_type(ir->t));
  case IR_KINT: return lj_ir_kint(J, ir->i);
  case IR_KGC: return lj_ir_kgc(J, ir_kgc(ir), irt_t(ir->t));
  case IR_KNUM: case IR_KINT64:
    return lj_ir_k64(J, (IROp)ir->o, ir_k64(ir)->u64);
  case IR_KPTR: return lj_ir_kptr(J, ir_kptr(ir));  /* Continuation. */
  default: lj_assertJ(0, "bad IR constant op %d", ir->o); return TREF_NIL;
  }
}